

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

void tty_get(void)

{
  int __fd;
  DLTTY_IN_CSB *pDVar1;
  ssize_t sVar2;
  char indata [256];
  char local_108 [264];
  
  __fd = TTY_Fd;
  if ((-1 < TTY_Fd) && (((uint)*DLTTYIn & 1) == 0)) {
    DLTTYIn->in_data = '\0';
    sVar2 = read(__fd,local_108,1);
    pDVar1 = DLTTYIn;
    if (sVar2 != 1) {
      error("TTY: tty_get");
      return;
    }
    DLTTYIn->in_data = local_108[0];
    *(byte *)pDVar1 = *(byte *)pDVar1 | 1;
  }
  return;
}

Assistant:

void tty_get(void)
{
  char indata[256];

  if ((TTY_Fd >= 0) && !DLTTYIn->state) {
    DLTTYIn->in_data = '\0'; /* Clear Previous Data */

    if (read(TTY_Fd, indata, 1) == 1) {
      DLTTYIn->in_data = indata[0];
      DLTTYIn->state = 1;
    } else {
      error("TTY: tty_get");
    }
  }
}